

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHThreads_Test::TestBody(SSLTest_ECHThreads_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  EVP_HPKE_KEM *pEVar4;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  thread *thread;
  undefined1 auVar5 [8];
  _Head_base<0UL,_unsigned_char_*,_false> *this_00;
  char *in_R9;
  char *pcVar6;
  pointer *__ptr;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  UniquePtr<SSL> client;
  UniquePtr<SSL_ECH_KEYS> keys12;
  UniquePtr<SSL_ECH_KEYS> keys1;
  uint8_t *ech_config1;
  UniquePtr<SSL> server;
  UniquePtr<uint8_t> free_ech_config2;
  uint8_t *ech_config2;
  UniquePtr<uint8_t> free_ech_config1;
  size_t ech_config2_len;
  size_t ech_config1_len;
  ScopedEVP_HPKE_KEY key2;
  ScopedEVP_HPKE_KEY key1;
  undefined1 local_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_190;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_188;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_180;
  undefined1 local_178 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Head_base<0UL,_ssl_st_*,_false> local_158;
  undefined1 local_150 [24];
  Message local_138;
  _Head_base<0UL,_unsigned_char_*,_false> local_130;
  __uniq_ptr_impl<ssl_st,_bssl::internal::Deleter> local_128;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_120;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_118;
  _Head_base<0UL,_unsigned_char_*,_false> local_110;
  AssertHelper local_108;
  size_t local_100;
  undefined1 local_f8 [16];
  EVP_HPKE_KEM local_e8;
  EVP_HPKE_KEY local_88;
  
  EVP_HPKE_KEY_zero(&local_88);
  pEVar4 = EVP_hpke_x25519_hkdf_sha256();
  iVar3 = EVP_HPKE_KEY_generate(&local_88,pEVar4);
  local_178[0] = iVar3 != 0;
  paStack_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_178,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9a5,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)local_198);
    this_00 = &local_130;
  }
  else {
    pcVar6 = &DAT_00000010;
    iVar3 = SSL_marshal_ech_config
                      (&local_130._M_head_impl,&local_100,'\x01',&local_88,"public.example",0x10);
    local_178[0] = iVar3 != 0;
    paStack_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
    if (iVar3 != 0) {
      local_110._M_head_impl = local_130._M_head_impl;
      EVP_HPKE_KEY_zero((EVP_HPKE_KEY *)local_f8);
      pEVar4 = EVP_hpke_x25519_hkdf_sha256();
      iVar3 = EVP_HPKE_KEY_generate((EVP_HPKE_KEY *)local_f8,pEVar4);
      local_198[0] = iVar3 != 0;
      local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_118);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_178,(internal *)local_198,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256())","false","true"
                   ,pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x9ad,(char *)local_178);
        testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        if (local_178 != (undefined1  [8])&local_168) {
          operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
        }
LAB_0016c94b:
        if (local_118._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_118._M_head_impl + 8))();
        }
        if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_190,local_190);
        }
      }
      else {
        pcVar6 = &DAT_00000010;
        iVar3 = SSL_marshal_ech_config
                          ((uint8_t **)&local_118,(size_t *)&local_108,'\x02',
                           (EVP_HPKE_KEY *)local_f8,"public.example",0x10);
        local_198[0] = iVar3 != 0;
        local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_178,(internal *)local_198,
                     (AssertionResult *)
                     "SSL_marshal_ech_config(&ech_config2, &ech_config2_len, 2, key2.get(), \"public.example\", 16)"
                     ,"false","true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)(local_150 + 8),kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b2,(char *)local_178);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)(local_150 + 8),(Message *)&local_120);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_150 + 8));
          local_118._M_head_impl = local_120._M_head_impl;
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            local_118._M_head_impl = local_120._M_head_impl;
          }
          goto LAB_0016c94b;
        }
        local_120._M_head_impl = local_118._M_head_impl;
        local_150._8_8_ = SSL_ECH_KEYS_new();
        local_198[0] = (SSL_ECH_KEYS *)local_150._8_8_ != (SSL_ECH_KEYS *)0x0;
        local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((SSL_ECH_KEYS *)local_150._8_8_ == (SSL_ECH_KEYS *)0x0) {
          testing::Message::Message((Message *)local_150);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_178,(internal *)local_198,(AssertionResult *)"keys1","false",
                     "true",pcVar6);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_188,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x9b7,(char *)local_178);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_188,(Message *)local_150);
LAB_0016ca33:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
          if (local_178 != (undefined1  [8])&local_168) {
            operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
          }
          if ((SSL_ECH_KEYS *)local_150._0_8_ != (SSL_ECH_KEYS *)0x0) {
            (**(code **)(*(long *)local_150._0_8_ + 8))();
          }
          if (local_190 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_190,local_190);
          }
        }
        else {
          iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_150._8_8_,1,local_130._M_head_impl,
                                   local_100,&local_88);
          local_198[0] = iVar3 != 0;
          local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)local_150);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_178,(internal *)local_198,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys1.get(), 1, ech_config1, ech_config1_len, key1.get())",
                       "false","true",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_188,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9b9,(char *)local_178);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_188,(Message *)local_150);
            goto LAB_0016ca33;
          }
          local_150._0_8_ = SSL_ECH_KEYS_new();
          local_198[0] = (SSL_ECH_KEYS *)local_150._0_8_ != (SSL_ECH_KEYS *)0x0;
          local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((SSL_ECH_KEYS *)local_150._0_8_ == (SSL_ECH_KEYS *)0x0) {
            testing::Message::Message((Message *)&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_178,(internal *)local_198,(AssertionResult *)"keys12","false"
                       ,"true",pcVar6);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_180,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x9bb,(char *)local_178);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_180,(Message *)&local_188);
LAB_0016cbaa:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_180);
            if (local_178 != (undefined1  [8])&local_168) {
              operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
            }
            if (local_188._M_head_impl != (SSL_CTX *)0x0) {
              (**(code **)(*(long *)local_188._M_head_impl + 8))();
            }
            if (local_190 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_190,local_190);
            }
          }
          else {
            iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_150._0_8_,1,
                                     (uint8_t *)local_118._M_head_impl,(size_t)local_108.data_,
                                     (EVP_HPKE_KEY *)local_f8);
            local_198[0] = iVar3 != 0;
            local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_188);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_178,(internal *)local_198,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 1, ech_config2, ech_config2_len, key2.get())"
                         ,"false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_180,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bd,(char *)local_178);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_180,(Message *)&local_188);
              goto LAB_0016cbaa;
            }
            iVar3 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)local_150._0_8_,0,local_130._M_head_impl,
                                     local_100,&local_88);
            local_198[0] = iVar3 != 0;
            local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_188);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_178,(internal *)local_198,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys12.get(), 0, ech_config1, ech_config1_len, key1.get())"
                         ,"false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_180,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9bf,(char *)local_178);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_180,(Message *)&local_188);
              goto LAB_0016cbaa;
            }
            method = TLS_method();
            CreateContextWithTestCertificate((anon_unknown_0 *)&local_188,method);
            local_198[0] = local_188._M_head_impl != (SSL_CTX *)0x0;
            local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_188._M_head_impl == (SSL_CTX *)0x0) {
              testing::Message::Message((Message *)&local_180);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_178,(internal *)local_198,(AssertionResult *)"server_ctx",
                         "false","true",pcVar6);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_158,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x9c3,(char *)local_178);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_158,(Message *)&local_180);
LAB_0016ccbc:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_158);
              if (local_178 != (undefined1  [8])&local_168) {
                operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
              }
              if (local_180._M_head_impl != (SSL_CTX *)0x0) {
                (**(code **)(*(long *)local_180._M_head_impl + 8))();
              }
              if (local_190 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_190,local_190);
              }
            }
            else {
              iVar3 = SSL_CTX_set1_ech_keys(local_188._M_head_impl,(SSL_ECH_KEYS *)local_150._8_8_);
              local_198[0] = iVar3 != 0;
              local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_180);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_178,(internal *)local_198,
                           (AssertionResult *)"SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get())"
                           ,"false","true",pcVar6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_158,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c4,(char *)local_178);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_158,(Message *)&local_180);
                goto LAB_0016ccbc;
              }
              meth = (SSL_METHOD *)TLS_method();
              local_180._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
              local_198[0] = local_180._M_head_impl != (SSL_CTX *)0x0;
              local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_180._M_head_impl == (SSL_CTX *)0x0) {
                testing::Message::Message((Message *)&local_158);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_178,(internal *)local_198,(AssertionResult *)"client_ctx"
                           ,"false","true",pcVar6);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x9c7,(char *)local_178);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&local_158);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if (local_178 != (undefined1  [8])&local_168) {
                  operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
                }
                if (local_158._M_head_impl != (SSL *)0x0) {
                  (*(local_158._M_head_impl)->method->ssl_new)(local_158._M_head_impl);
                }
                if (local_190 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_190,local_190);
                }
              }
              else {
                local_158._M_head_impl = (SSL *)0x0;
                local_128._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
                     (tuple<ssl_st_*,_bssl::internal::Deleter>)
                     (_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)0x0;
                bVar2 = CreateClientAndServer
                                  ((UniquePtr<SSL> *)&local_158,(UniquePtr<SSL> *)&local_128,
                                   local_180._M_head_impl,local_188._M_head_impl);
                local_198[0] = bVar2;
                local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (bVar2) {
                  bVar2 = InstallECHConfigList
                                    (local_158._M_head_impl,(SSL_ECH_KEYS *)local_150._8_8_);
                  local_198[0] = bVar2;
                  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (!bVar2) {
                    testing::Message::Message(&local_138);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_178,(internal *)local_198,
                               (AssertionResult *)"InstallECHConfigList(client.get(), keys1.get())",
                               "false","true",pcVar6);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)(local_150 + 0x10),kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x9cb,(char *)local_178);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)(local_150 + 0x10),&local_138);
                    goto LAB_0016ce7e;
                  }
                  local_178 = (undefined1  [8])0x0;
                  paStack_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
                  local_168._M_allocated_capacity = 0;
                  local_198 = (undefined1  [8])&local_158;
                  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_128;
                  std::vector<std::thread,std::allocator<std::thread>>::
                  emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__0>
                            ((vector<std::thread,std::allocator<std::thread>> *)local_178,
                             (anon_class_16_2_60d54371_for__M_head_impl *)local_198);
                  local_190 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_150;
                  local_198 = (undefined1  [8])&local_188;
                  std::vector<std::thread,std::allocator<std::thread>>::
                  emplace_back<bssl::(anonymous_namespace)::SSLTest_ECHThreads_Test::TestBody()::__1>
                            ((vector<std::thread,std::allocator<std::thread>> *)local_178,
                             (anon_class_16_2_80de2b63_for__M_head_impl *)local_198);
                  paVar1 = paStack_170;
                  for (auVar5 = local_178; auVar5 != (undefined1  [8])paVar1;
                      auVar5 = (undefined1  [8])((long)auVar5 + 8)) {
                    std::thread::join();
                  }
                  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                            ((vector<std::thread,_std::allocator<std::thread>_> *)local_178);
                }
                else {
                  testing::Message::Message(&local_138);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_178,(internal *)local_198,
                             (AssertionResult *)
                             "CreateClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                             ,"false","true",pcVar6);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)(local_150 + 0x10),kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x9ca,(char *)local_178);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)(local_150 + 0x10),&local_138);
LAB_0016ce7e:
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_150 + 0x10))
                  ;
                  if (local_178 != (undefined1  [8])&local_168) {
                    operator_delete((void *)local_178,local_168._M_allocated_capacity + 1);
                  }
                  if (local_138.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl !=
                      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                       )0x0) {
                    (**(code **)(*(long *)local_138.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl + 8))();
                  }
                  if (local_190 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_190,local_190);
                  }
                }
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_128);
                std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_158);
              }
              std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_180);
            }
            std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_188);
          }
          std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)local_150);
        }
        std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter> *)(local_150 + 8));
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_120);
      }
      EVP_HPKE_KEY_cleanup((EVP_HPKE_KEY *)local_f8);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_110);
      goto LAB_0016cf31;
    }
    testing::Message::Message((Message *)local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_178,
               (AssertionResult *)
               "SSL_marshal_ech_config(&ech_config1, &ech_config1_len, 1, key1.get(), \"public.example\", 16)"
               ,"false","true",pcVar6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_110,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x9aa,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_110,(Message *)local_198);
    this_00 = &local_110;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if ((EVP_HPKE_KEM *)local_f8._0_8_ != &local_e8) {
    operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_198 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    (**(code **)(*(long *)local_198 + 8))();
  }
  if (paStack_170 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&paStack_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_170);
  }
LAB_0016cf31:
  EVP_HPKE_KEY_cleanup(&local_88);
  return;
}

Assistant:

TEST(SSLTest, ECHThreads) {
  // Generate a pair of ECHConfigs.
  bssl::ScopedEVP_HPKE_KEY key1;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key1.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config1;
  size_t ech_config1_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config1, &ech_config1_len,
                                     /*config_id=*/1, key1.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config1(ech_config1);
  bssl::ScopedEVP_HPKE_KEY key2;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key2.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t *ech_config2;
  size_t ech_config2_len;
  ASSERT_TRUE(SSL_marshal_ech_config(&ech_config2, &ech_config2_len,
                                     /*config_id=*/2, key2.get(),
                                     "public.example", 16));
  bssl::UniquePtr<uint8_t> free_ech_config2(ech_config2);

  // |keys1| contains the first config. |keys12| contains both.
  bssl::UniquePtr<SSL_ECH_KEYS> keys1(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys1);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys1.get(), /*is_retry_config=*/1, ech_config1,
                               ech_config1_len, key1.get()));
  bssl::UniquePtr<SSL_ECH_KEYS> keys12(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys12);
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/1, ech_config2,
                               ech_config2_len, key2.get()));
  ASSERT_TRUE(SSL_ECH_KEYS_add(keys12.get(), /*is_retry_config=*/0, ech_config1,
                               ech_config1_len, key1.get()));

  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys1.get()));

  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(client_ctx);
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(CreateClientAndServer(&client, &server, client_ctx.get(),
                                    server_ctx.get()));
  ASSERT_TRUE(InstallECHConfigList(client.get(), keys1.get()));

  // In parallel, complete the connection and reconfigure the ECHConfig. Note
  // |keys12| supports all the keys in |keys1|, so the handshake should complete
  // the same whichever the server uses.
  std::vector<std::thread> threads;
  threads.emplace_back([&] {
    ASSERT_TRUE(CompleteHandshakes(client.get(), server.get()));
    EXPECT_TRUE(SSL_ech_accepted(client.get()));
    EXPECT_TRUE(SSL_ech_accepted(server.get()));
  });
  threads.emplace_back([&] {
    EXPECT_TRUE(SSL_CTX_set1_ech_keys(server_ctx.get(), keys12.get()));
  });
  for (auto &thread : threads) {
    thread.join();
  }
}